

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O3

void __thiscall
helics::NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4>::
generateLocalAddressString_abi_cxx11_
          (NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4> *this)

{
  long in_RSI;
  
  generateLocalAddressString_abi_cxx11_
            ((string *)this,
             (NetworkCore<helics::inproc::InprocComms,(gmlc::networking::InterfaceTypes)4> *)
             (in_RSI + -8));
  return;
}

Assistant:

std::string NetworkCore<COMMS, baseline>::generateLocalAddressString() const
{
    std::string add;
    if (CommsBroker<COMMS, CommonCore>::comms->isConnected()) {
        add = CommsBroker<COMMS, CommonCore>::comms->getAddress();
    } else {
        std::lock_guard<std::mutex> lock(dataMutex);
        switch (baseline) {
            case InterfaceTypes::TCP:
            case InterfaceTypes::IP:
            case InterfaceTypes::UDP:
                if (!netInfo.localInterface.empty() && (netInfo.localInterface.back() == '*')) {
                    add = gmlc::networking::makePortAddress(
                        netInfo.localInterface.substr(0, netInfo.localInterface.size() - 1),
                        netInfo.portNumber);
                } else {
                    add = gmlc::networking::makePortAddress(netInfo.localInterface,
                                                            netInfo.portNumber);
                }
                break;
            case InterfaceTypes::INPROC:
            case InterfaceTypes::IPC:
            default:
                if (!netInfo.localInterface.empty()) {
                    add = netInfo.localInterface;
                } else {
                    add = CommonCore::getIdentifier();
                }
                break;
        }
    }
    return add;
}